

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O0

int xmlStrncmp(xmlChar *str1,xmlChar *str2,int len)

{
  byte bVar1;
  int local_24;
  int tmp;
  int len_local;
  xmlChar *str2_local;
  xmlChar *str1_local;
  
  if (len < 1) {
    str1_local._4_4_ = 0;
  }
  else if (str1 == str2) {
    str1_local._4_4_ = 0;
  }
  else if (str1 == (xmlChar *)0x0) {
    str1_local._4_4_ = -1;
  }
  else {
    local_24 = len;
    _tmp = str2;
    str2_local = str1;
    if (str2 == (xmlChar *)0x0) {
      str1_local._4_4_ = 1;
    }
    else {
      do {
        if ((uint)*str2_local - (uint)*_tmp != 0) {
          return (uint)*str2_local - (uint)*_tmp;
        }
        local_24 = local_24 + -1;
        if (local_24 == 0) {
          return 0;
        }
        bVar1 = *_tmp;
        _tmp = _tmp + 1;
        str2_local = str2_local + 1;
      } while (bVar1 != 0);
      str1_local._4_4_ = 0;
    }
  }
  return str1_local._4_4_;
}

Assistant:

int
xmlStrncmp(const xmlChar *str1, const xmlChar *str2, int len) {
    if (len <= 0) return(0);
    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strncmp((const char *)str1, (const char *)str2, len));
#else
    do {
        int tmp = *str1++ - *str2;
        if (tmp != 0 || --len == 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
#endif
}